

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  parasail_result_t *ppVar15;
  __m128i *ptr;
  __m128i *palVar16;
  __m128i *ptr_00;
  int16_t *ptr_01;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  __m128i *ptr_02;
  ulong uVar23;
  undefined2 uVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  int16_t iVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  long lVar37;
  bool bVar38;
  undefined4 uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  short sVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  short sVar50;
  undefined1 auVar51 [16];
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  ulong uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ushort uVar68;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar78;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar39;
  short sVar44;
  short sVar77;
  short sVar79;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sg_flags_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar19 = profile->s1Len;
        if ((int)uVar19 < 1) {
          parasail_sg_flags_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_striped_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_striped_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_striped_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_striped_profile_sse2_128_16_cold_1();
        }
        else {
          iVar13 = uVar19 - 1;
          uVar26 = (ulong)uVar19 + 7 >> 3;
          uVar25 = (uint)uVar26;
          iVar14 = iVar13 / (int)uVar25;
          uVar36 = -open;
          uVar29 = ppVar4->min;
          iVar32 = -uVar29;
          if (uVar29 != uVar36 && SBORROW4(uVar29,uVar36) == (int)(uVar29 + open) < 0) {
            iVar32 = open;
          }
          iVar21 = ppVar4->max;
          ppVar15 = parasail_result_new();
          if (ppVar15 != (parasail_result_t *)0x0) {
            ppVar15->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar15->flag | 0x8200802;
            ptr = parasail_memalign___m128i(0x10,uVar26);
            palVar16 = parasail_memalign___m128i(0x10,uVar26);
            ptr_00 = parasail_memalign___m128i(0x10,uVar26);
            ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int16_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (palVar16 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
              iVar17 = s2Len + -1;
              uVar28 = 7 - iVar14;
              auVar41 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar40 = auVar41._0_4_;
              auVar51._4_4_ = uVar40;
              auVar51._0_4_ = uVar40;
              auVar51._8_4_ = uVar40;
              auVar51._12_4_ = uVar40;
              auVar41 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar40 = auVar41._0_4_;
              uVar18 = iVar32 - 0x7fff;
              auVar41 = pshuflw(ZEXT416(uVar18),ZEXT416(uVar18),0);
              auVar42._0_4_ = auVar41._0_4_;
              auVar42._4_4_ = auVar42._0_4_;
              auVar42._8_4_ = auVar42._0_4_;
              auVar42._12_4_ = auVar42._0_4_;
              auVar45 = ZEXT416(CONCAT22((short)(uVar29 >> 0x10),0x7ffe - (short)iVar21));
              auVar45 = pshuflw(auVar45,auVar45,0);
              auVar46._0_4_ = auVar45._0_4_;
              auVar46._4_4_ = auVar46._0_4_;
              auVar46._8_4_ = auVar46._0_4_;
              auVar46._12_4_ = auVar46._0_4_;
              auVar48 = pshuflw(ZEXT416(uVar28),ZEXT416(uVar28),0);
              sVar52 = auVar48._0_2_;
              sVar39 = auVar48._2_2_;
              lVar27 = (long)(int)uVar36;
              uVar34 = 0;
              do {
                lVar22 = 0;
                lVar37 = lVar27;
                do {
                  lVar30 = lVar37;
                  if (s1_beg != 0) {
                    lVar30 = 0;
                  }
                  uVar24 = 0x8000;
                  if (-0x8000 < lVar30) {
                    uVar24 = (undefined2)lVar30;
                  }
                  *(undefined2 *)((long)&local_48 + lVar22 * 2) = uVar24;
                  lVar30 = lVar30 - (ulong)(uint)open;
                  if (lVar30 < -0x7fff) {
                    lVar30 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar22 * 2) = (short)lVar30;
                  lVar22 = lVar22 + 1;
                  lVar37 = lVar37 - uVar26 * (uint)gap;
                } while (lVar22 != 8);
                ptr[uVar34][0] = local_48;
                ptr[uVar34][1] = lStack_40;
                ptr_00[uVar34][0] = local_58;
                ptr_00[uVar34][1] = lStack_50;
                uVar34 = uVar34 + 1;
                lVar27 = lVar27 - (ulong)(uint)gap;
              } while (uVar34 != uVar26);
              *ptr_01 = 0;
              uVar34 = 1;
              uVar29 = uVar36;
              do {
                iVar31 = -0x8000;
                if (-0x8000 < (int)uVar29) {
                  iVar31 = (int16_t)uVar29;
                }
                if (s2_beg != 0) {
                  iVar31 = 0;
                }
                ptr_01[uVar34] = iVar31;
                uVar34 = uVar34 + 1;
                uVar29 = uVar29 - gap;
              } while (s2Len + 1 != uVar34);
              uVar34 = 1;
              if (1 < s2Len) {
                uVar34 = (ulong)(uint)s2Len;
              }
              lVar27 = (ulong)(uVar25 + (uVar25 == 0)) << 4;
              uVar35 = 0;
              auVar48 = auVar42;
              auVar62 = auVar42;
              iVar32 = iVar17;
              do {
                ptr_02 = ptr;
                ptr = palVar16;
                uVar23 = ptr_02[uVar25 - 1][0];
                iVar21 = ppVar4->mapper[(byte)s2[uVar35]];
                auVar66._8_8_ = ptr_02[uVar25 - 1][1] << 0x10 | uVar23 >> 0x30;
                auVar66._0_8_ = uVar23 << 0x10 | (ulong)(ushort)ptr_01[uVar35];
                lVar37 = 0;
                auVar49 = auVar48;
                auVar61 = auVar42;
                do {
                  auVar48 = paddsw(auVar66,*(undefined1 (*) [16])
                                            ((long)pvVar3 + lVar37 + uVar26 * (long)iVar21 * 0x10));
                  auVar66 = *(undefined1 (*) [16])((long)*ptr_00 + lVar37);
                  sVar44 = auVar61._0_2_;
                  sVar54 = auVar66._0_2_;
                  uVar68 = (ushort)(sVar54 < sVar44) * sVar44 | (ushort)(sVar54 >= sVar44) * sVar54;
                  sVar5 = auVar61._2_2_;
                  sVar55 = auVar66._2_2_;
                  uVar71 = (ushort)(sVar55 < sVar5) * sVar5 | (ushort)(sVar55 >= sVar5) * sVar55;
                  sVar6 = auVar61._4_2_;
                  sVar56 = auVar66._4_2_;
                  uVar72 = (ushort)(sVar56 < sVar6) * sVar6 | (ushort)(sVar56 >= sVar6) * sVar56;
                  sVar7 = auVar61._6_2_;
                  sVar57 = auVar66._6_2_;
                  uVar73 = (ushort)(sVar57 < sVar7) * sVar7 | (ushort)(sVar57 >= sVar7) * sVar57;
                  sVar8 = auVar61._8_2_;
                  sVar58 = auVar66._8_2_;
                  uVar74 = (ushort)(sVar58 < sVar8) * sVar8 | (ushort)(sVar58 >= sVar8) * sVar58;
                  sVar9 = auVar61._10_2_;
                  sVar59 = auVar66._10_2_;
                  uVar75 = (ushort)(sVar59 < sVar9) * sVar9 | (ushort)(sVar59 >= sVar9) * sVar59;
                  sVar10 = auVar61._12_2_;
                  sVar77 = auVar66._12_2_;
                  sVar79 = auVar66._14_2_;
                  uVar76 = (ushort)(sVar77 < sVar10) * sVar10 | (ushort)(sVar77 >= sVar10) * sVar77;
                  sVar53 = auVar61._14_2_;
                  uVar78 = (ushort)(sVar79 < sVar53) * sVar53 | (ushort)(sVar79 >= sVar53) * sVar79;
                  sVar47 = auVar48._0_2_;
                  auVar69._0_2_ =
                       (ushort)((short)uVar68 < sVar47) * sVar47 |
                       ((short)uVar68 >= sVar47) * uVar68;
                  sVar47 = auVar48._2_2_;
                  auVar69._2_2_ =
                       (ushort)((short)uVar71 < sVar47) * sVar47 |
                       ((short)uVar71 >= sVar47) * uVar71;
                  sVar47 = auVar48._4_2_;
                  auVar69._4_2_ =
                       (ushort)((short)uVar72 < sVar47) * sVar47 |
                       ((short)uVar72 >= sVar47) * uVar72;
                  sVar47 = auVar48._6_2_;
                  auVar69._6_2_ =
                       (ushort)((short)uVar73 < sVar47) * sVar47 |
                       ((short)uVar73 >= sVar47) * uVar73;
                  sVar47 = auVar48._8_2_;
                  auVar69._8_2_ =
                       (ushort)((short)uVar74 < sVar47) * sVar47 |
                       ((short)uVar74 >= sVar47) * uVar74;
                  sVar47 = auVar48._10_2_;
                  auVar69._10_2_ =
                       (ushort)((short)uVar75 < sVar47) * sVar47 |
                       ((short)uVar75 >= sVar47) * uVar75;
                  sVar47 = auVar48._12_2_;
                  auVar69._12_2_ =
                       (ushort)((short)uVar76 < sVar47) * sVar47 |
                       ((short)uVar76 >= sVar47) * uVar76;
                  sVar47 = auVar48._14_2_;
                  auVar69._14_2_ =
                       (ushort)((short)uVar78 < sVar47) * sVar47 |
                       ((short)uVar78 >= sVar47) * uVar78;
                  *(undefined1 (*) [16])((long)*ptr + lVar37) = auVar69;
                  sVar47 = auVar49._0_2_;
                  auVar48._0_2_ =
                       (sVar47 < (short)auVar69._0_2_) * auVar69._0_2_ |
                       (ushort)(sVar47 >= (short)auVar69._0_2_) * sVar47;
                  sVar47 = auVar49._2_2_;
                  auVar48._2_2_ =
                       (sVar47 < (short)auVar69._2_2_) * auVar69._2_2_ |
                       (ushort)(sVar47 >= (short)auVar69._2_2_) * sVar47;
                  sVar47 = auVar49._4_2_;
                  auVar48._4_2_ =
                       (sVar47 < (short)auVar69._4_2_) * auVar69._4_2_ |
                       (ushort)(sVar47 >= (short)auVar69._4_2_) * sVar47;
                  sVar47 = auVar49._6_2_;
                  auVar48._6_2_ =
                       (sVar47 < (short)auVar69._6_2_) * auVar69._6_2_ |
                       (ushort)(sVar47 >= (short)auVar69._6_2_) * sVar47;
                  sVar47 = auVar49._8_2_;
                  auVar48._8_2_ =
                       (sVar47 < (short)auVar69._8_2_) * auVar69._8_2_ |
                       (ushort)(sVar47 >= (short)auVar69._8_2_) * sVar47;
                  sVar47 = auVar49._10_2_;
                  auVar48._10_2_ =
                       (sVar47 < (short)auVar69._10_2_) * auVar69._10_2_ |
                       (ushort)(sVar47 >= (short)auVar69._10_2_) * sVar47;
                  sVar47 = auVar49._12_2_;
                  sVar50 = auVar49._14_2_;
                  auVar48._12_2_ =
                       (sVar47 < (short)auVar69._12_2_) * auVar69._12_2_ |
                       (ushort)(sVar47 >= (short)auVar69._12_2_) * sVar47;
                  auVar48._14_2_ =
                       (sVar50 < (short)auVar69._14_2_) * auVar69._14_2_ |
                       (ushort)(sVar50 >= (short)auVar69._14_2_) * sVar50;
                  sVar47 = auVar46._0_2_;
                  uVar68 = (ushort)(sVar54 < sVar47) * sVar54 | (ushort)(sVar54 >= sVar47) * sVar47;
                  sVar47 = auVar46._2_2_;
                  uVar71 = (ushort)(sVar55 < sVar47) * sVar55 | (ushort)(sVar55 >= sVar47) * sVar47;
                  sVar47 = auVar46._4_2_;
                  uVar72 = (ushort)(sVar56 < sVar47) * sVar56 | (ushort)(sVar56 >= sVar47) * sVar47;
                  sVar47 = auVar46._6_2_;
                  uVar73 = (ushort)(sVar57 < sVar47) * sVar57 | (ushort)(sVar57 >= sVar47) * sVar47;
                  sVar47 = auVar46._8_2_;
                  uVar74 = (ushort)(sVar58 < sVar47) * sVar58 | (ushort)(sVar58 >= sVar47) * sVar47;
                  sVar47 = auVar46._10_2_;
                  uVar75 = (ushort)(sVar59 < sVar47) * sVar59 | (ushort)(sVar59 >= sVar47) * sVar47;
                  sVar47 = auVar46._12_2_;
                  sVar50 = auVar46._14_2_;
                  uVar76 = (ushort)(sVar77 < sVar47) * sVar77 | (ushort)(sVar77 >= sVar47) * sVar47;
                  uVar78 = (ushort)(sVar79 < sVar50) * sVar79 | (ushort)(sVar79 >= sVar50) * sVar50;
                  uVar68 = (ushort)(sVar44 < (short)uVar68) * sVar44 |
                           (sVar44 >= (short)uVar68) * uVar68;
                  uVar71 = (ushort)(sVar5 < (short)uVar71) * sVar5 |
                           (sVar5 >= (short)uVar71) * uVar71;
                  uVar72 = (ushort)(sVar6 < (short)uVar72) * sVar6 |
                           (sVar6 >= (short)uVar72) * uVar72;
                  uVar73 = (ushort)(sVar7 < (short)uVar73) * sVar7 |
                           (sVar7 >= (short)uVar73) * uVar73;
                  uVar74 = (ushort)(sVar8 < (short)uVar74) * sVar8 |
                           (sVar8 >= (short)uVar74) * uVar74;
                  uVar75 = (ushort)(sVar9 < (short)uVar75) * sVar9 |
                           (sVar9 >= (short)uVar75) * uVar75;
                  uVar76 = (ushort)(sVar10 < (short)uVar76) * sVar10 |
                           (sVar10 >= (short)uVar76) * uVar76;
                  uVar78 = (ushort)(sVar53 < (short)uVar78) * sVar53 |
                           (sVar53 >= (short)uVar78) * uVar78;
                  auVar46._0_2_ =
                       ((short)auVar69._0_2_ < (short)uVar68) * auVar69._0_2_ |
                       ((short)auVar69._0_2_ >= (short)uVar68) * uVar68;
                  auVar46._2_2_ =
                       ((short)auVar69._2_2_ < (short)uVar71) * auVar69._2_2_ |
                       ((short)auVar69._2_2_ >= (short)uVar71) * uVar71;
                  auVar46._4_2_ =
                       ((short)auVar69._4_2_ < (short)uVar72) * auVar69._4_2_ |
                       ((short)auVar69._4_2_ >= (short)uVar72) * uVar72;
                  auVar46._6_2_ =
                       ((short)auVar69._6_2_ < (short)uVar73) * auVar69._6_2_ |
                       ((short)auVar69._6_2_ >= (short)uVar73) * uVar73;
                  auVar46._8_2_ =
                       ((short)auVar69._8_2_ < (short)uVar74) * auVar69._8_2_ |
                       ((short)auVar69._8_2_ >= (short)uVar74) * uVar74;
                  auVar46._10_2_ =
                       ((short)auVar69._10_2_ < (short)uVar75) * auVar69._10_2_ |
                       ((short)auVar69._10_2_ >= (short)uVar75) * uVar75;
                  auVar46._12_2_ =
                       ((short)auVar69._12_2_ < (short)uVar76) * auVar69._12_2_ |
                       ((short)auVar69._12_2_ >= (short)uVar76) * uVar76;
                  auVar46._14_2_ =
                       ((short)auVar69._14_2_ < (short)uVar78) * auVar69._14_2_ |
                       ((short)auVar69._14_2_ >= (short)uVar78) * uVar78;
                  auVar70 = psubsw(auVar69,auVar51);
                  auVar49._4_4_ = uVar40;
                  auVar49._0_4_ = uVar40;
                  auVar49._8_4_ = uVar40;
                  auVar49._12_4_ = uVar40;
                  auVar66 = psubsw(auVar66,auVar49);
                  sVar44 = auVar70._0_2_;
                  sVar53 = auVar66._0_2_;
                  sVar47 = auVar70._2_2_;
                  sVar50 = auVar66._2_2_;
                  sVar5 = auVar70._4_2_;
                  sVar54 = auVar66._4_2_;
                  sVar6 = auVar70._6_2_;
                  sVar55 = auVar66._6_2_;
                  sVar7 = auVar70._8_2_;
                  sVar56 = auVar66._8_2_;
                  sVar8 = auVar70._10_2_;
                  sVar57 = auVar66._10_2_;
                  sVar9 = auVar70._12_2_;
                  sVar58 = auVar66._12_2_;
                  sVar59 = auVar66._14_2_;
                  sVar10 = auVar70._14_2_;
                  puVar1 = (ushort *)((long)*ptr_00 + lVar37);
                  *puVar1 = (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53
                  ;
                  puVar1[1] = (ushort)(sVar50 < sVar47) * sVar47 |
                              (ushort)(sVar50 >= sVar47) * sVar50;
                  puVar1[2] = (ushort)(sVar54 < sVar5) * sVar5 | (ushort)(sVar54 >= sVar5) * sVar54;
                  puVar1[3] = (ushort)(sVar55 < sVar6) * sVar6 | (ushort)(sVar55 >= sVar6) * sVar55;
                  puVar1[4] = (ushort)(sVar56 < sVar7) * sVar7 | (ushort)(sVar56 >= sVar7) * sVar56;
                  puVar1[5] = (ushort)(sVar57 < sVar8) * sVar8 | (ushort)(sVar57 >= sVar8) * sVar57;
                  puVar1[6] = (ushort)(sVar58 < sVar9) * sVar9 | (ushort)(sVar58 >= sVar9) * sVar58;
                  puVar1[7] = (ushort)(sVar59 < sVar10) * sVar10 |
                              (ushort)(sVar59 >= sVar10) * sVar59;
                  auVar70._4_4_ = uVar40;
                  auVar70._0_4_ = uVar40;
                  auVar70._8_4_ = uVar40;
                  auVar70._12_4_ = uVar40;
                  auVar66 = psubsw(auVar61,auVar70);
                  sVar53 = auVar66._0_2_;
                  auVar61._0_2_ =
                       (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
                  sVar44 = auVar66._2_2_;
                  auVar61._2_2_ =
                       (ushort)(sVar44 < sVar47) * sVar47 | (ushort)(sVar44 >= sVar47) * sVar44;
                  sVar44 = auVar66._4_2_;
                  auVar61._4_2_ =
                       (ushort)(sVar44 < sVar5) * sVar5 | (ushort)(sVar44 >= sVar5) * sVar44;
                  sVar44 = auVar66._6_2_;
                  auVar61._6_2_ =
                       (ushort)(sVar44 < sVar6) * sVar6 | (ushort)(sVar44 >= sVar6) * sVar44;
                  sVar44 = auVar66._8_2_;
                  auVar61._8_2_ =
                       (ushort)(sVar44 < sVar7) * sVar7 | (ushort)(sVar44 >= sVar7) * sVar44;
                  sVar44 = auVar66._10_2_;
                  auVar61._10_2_ =
                       (ushort)(sVar44 < sVar8) * sVar8 | (ushort)(sVar44 >= sVar8) * sVar44;
                  sVar44 = auVar66._12_2_;
                  sVar47 = auVar66._14_2_;
                  auVar61._12_2_ =
                       (ushort)(sVar44 < sVar9) * sVar9 | (ushort)(sVar44 >= sVar9) * sVar44;
                  auVar61._14_2_ =
                       (ushort)(sVar47 < sVar10) * sVar10 | (ushort)(sVar47 >= sVar10) * sVar47;
                  auVar66 = *(undefined1 (*) [16])((long)*ptr_02 + lVar37);
                  lVar37 = lVar37 + 0x10;
                  auVar49 = auVar48;
                } while (lVar27 != lVar37);
                uVar29 = 0;
                do {
                  uVar20 = uVar36;
                  if (s2_beg == 0) {
                    uVar20 = ptr_01[uVar35 + 1] - open;
                  }
                  uVar23 = (ulong)uVar20;
                  if ((int)uVar20 < -0x7fff) {
                    uVar23 = 0xffff8000;
                  }
                  uVar60 = auVar61._0_8_;
                  auVar61._8_8_ = auVar61._8_8_ << 0x10 | uVar60 >> 0x30;
                  auVar61._0_8_ = uVar60 << 0x10 | uVar23 & 0xffff;
                  bVar38 = true;
                  uVar23 = 1;
                  lVar37 = 0;
                  auVar66 = auVar48;
                  auVar49 = auVar46;
                  do {
                    psVar2 = (short *)((long)*ptr + lVar37);
                    sVar47 = *psVar2;
                    sVar5 = psVar2[1];
                    sVar6 = psVar2[2];
                    sVar7 = psVar2[3];
                    sVar8 = psVar2[4];
                    sVar9 = psVar2[5];
                    sVar10 = psVar2[6];
                    sVar53 = psVar2[7];
                    sVar44 = auVar61._0_2_;
                    auVar64._0_2_ =
                         (ushort)(sVar47 < sVar44) * sVar44 | (ushort)(sVar47 >= sVar44) * sVar47;
                    sVar44 = auVar61._2_2_;
                    auVar64._2_2_ =
                         (ushort)(sVar5 < sVar44) * sVar44 | (ushort)(sVar5 >= sVar44) * sVar5;
                    sVar44 = auVar61._4_2_;
                    auVar64._4_2_ =
                         (ushort)(sVar6 < sVar44) * sVar44 | (ushort)(sVar6 >= sVar44) * sVar6;
                    sVar44 = auVar61._6_2_;
                    auVar64._6_2_ =
                         (ushort)(sVar7 < sVar44) * sVar44 | (ushort)(sVar7 >= sVar44) * sVar7;
                    sVar44 = auVar61._8_2_;
                    auVar64._8_2_ =
                         (ushort)(sVar8 < sVar44) * sVar44 | (ushort)(sVar8 >= sVar44) * sVar8;
                    sVar44 = auVar61._10_2_;
                    auVar64._10_2_ =
                         (ushort)(sVar9 < sVar44) * sVar44 | (ushort)(sVar9 >= sVar44) * sVar9;
                    sVar44 = auVar61._12_2_;
                    auVar64._12_2_ =
                         (ushort)(sVar10 < sVar44) * sVar44 | (ushort)(sVar10 >= sVar44) * sVar10;
                    sVar44 = auVar61._14_2_;
                    auVar64._14_2_ =
                         (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
                    *(undefined1 (*) [16])((long)*ptr + lVar37) = auVar64;
                    sVar44 = auVar49._0_2_;
                    auVar46._0_2_ =
                         ((short)auVar64._0_2_ < sVar44) * auVar64._0_2_ |
                         (ushort)((short)auVar64._0_2_ >= sVar44) * sVar44;
                    sVar44 = auVar49._2_2_;
                    auVar46._2_2_ =
                         ((short)auVar64._2_2_ < sVar44) * auVar64._2_2_ |
                         (ushort)((short)auVar64._2_2_ >= sVar44) * sVar44;
                    sVar44 = auVar49._4_2_;
                    auVar46._4_2_ =
                         ((short)auVar64._4_2_ < sVar44) * auVar64._4_2_ |
                         (ushort)((short)auVar64._4_2_ >= sVar44) * sVar44;
                    sVar44 = auVar49._6_2_;
                    auVar46._6_2_ =
                         ((short)auVar64._6_2_ < sVar44) * auVar64._6_2_ |
                         (ushort)((short)auVar64._6_2_ >= sVar44) * sVar44;
                    sVar44 = auVar49._8_2_;
                    auVar46._8_2_ =
                         ((short)auVar64._8_2_ < sVar44) * auVar64._8_2_ |
                         (ushort)((short)auVar64._8_2_ >= sVar44) * sVar44;
                    sVar44 = auVar49._10_2_;
                    auVar46._10_2_ =
                         ((short)auVar64._10_2_ < sVar44) * auVar64._10_2_ |
                         (ushort)((short)auVar64._10_2_ >= sVar44) * sVar44;
                    sVar44 = auVar49._12_2_;
                    sVar47 = auVar49._14_2_;
                    auVar46._12_2_ =
                         ((short)auVar64._12_2_ < sVar44) * auVar64._12_2_ |
                         (ushort)((short)auVar64._12_2_ >= sVar44) * sVar44;
                    auVar46._14_2_ =
                         ((short)auVar64._14_2_ < sVar47) * auVar64._14_2_ |
                         (ushort)((short)auVar64._14_2_ >= sVar47) * sVar47;
                    sVar44 = auVar66._0_2_;
                    auVar48._0_2_ =
                         (sVar44 < (short)auVar64._0_2_) * auVar64._0_2_ |
                         (ushort)(sVar44 >= (short)auVar64._0_2_) * sVar44;
                    sVar44 = auVar66._2_2_;
                    auVar48._2_2_ =
                         (sVar44 < (short)auVar64._2_2_) * auVar64._2_2_ |
                         (ushort)(sVar44 >= (short)auVar64._2_2_) * sVar44;
                    sVar44 = auVar66._4_2_;
                    auVar48._4_2_ =
                         (sVar44 < (short)auVar64._4_2_) * auVar64._4_2_ |
                         (ushort)(sVar44 >= (short)auVar64._4_2_) * sVar44;
                    sVar44 = auVar66._6_2_;
                    auVar48._6_2_ =
                         (sVar44 < (short)auVar64._6_2_) * auVar64._6_2_ |
                         (ushort)(sVar44 >= (short)auVar64._6_2_) * sVar44;
                    sVar44 = auVar66._8_2_;
                    auVar48._8_2_ =
                         (sVar44 < (short)auVar64._8_2_) * auVar64._8_2_ |
                         (ushort)(sVar44 >= (short)auVar64._8_2_) * sVar44;
                    sVar44 = auVar66._10_2_;
                    auVar48._10_2_ =
                         (sVar44 < (short)auVar64._10_2_) * auVar64._10_2_ |
                         (ushort)(sVar44 >= (short)auVar64._10_2_) * sVar44;
                    sVar44 = auVar66._12_2_;
                    sVar47 = auVar66._14_2_;
                    auVar48._12_2_ =
                         (sVar44 < (short)auVar64._12_2_) * auVar64._12_2_ |
                         (ushort)(sVar44 >= (short)auVar64._12_2_) * sVar44;
                    auVar48._14_2_ =
                         (sVar47 < (short)auVar64._14_2_) * auVar64._14_2_ |
                         (ushort)(sVar47 >= (short)auVar64._14_2_) * sVar47;
                    auVar66 = psubsw(auVar64,auVar51);
                    auVar11._4_4_ = uVar40;
                    auVar11._0_4_ = uVar40;
                    auVar11._8_4_ = uVar40;
                    auVar11._12_4_ = uVar40;
                    auVar61 = psubsw(auVar61,auVar11);
                    auVar67._0_2_ = -(ushort)(auVar66._0_2_ < auVar61._0_2_);
                    auVar67._2_2_ = -(ushort)(auVar66._2_2_ < auVar61._2_2_);
                    auVar67._4_2_ = -(ushort)(auVar66._4_2_ < auVar61._4_2_);
                    auVar67._6_2_ = -(ushort)(auVar66._6_2_ < auVar61._6_2_);
                    auVar67._8_2_ = -(ushort)(auVar66._8_2_ < auVar61._8_2_);
                    auVar67._10_2_ = -(ushort)(auVar66._10_2_ < auVar61._10_2_);
                    auVar67._12_2_ = -(ushort)(auVar66._12_2_ < auVar61._12_2_);
                    auVar67._14_2_ = -(ushort)(auVar66._14_2_ < auVar61._14_2_);
                    if ((((((((((((((((auVar67 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar67 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar67 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar67 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar67 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar67 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar67 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar67 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar67 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar67 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar67 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar67 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar67 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar67 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar67._14_2_ >> 7 & 1) == 0) && (auVar67._14_2_ & 0x8000) == 0) break;
                    bVar38 = uVar23 < uVar26;
                    lVar37 = lVar37 + 0x10;
                    uVar23 = uVar23 + 1;
                    auVar66 = auVar48;
                    auVar49 = auVar46;
                  } while (lVar27 != lVar37);
                } while ((!bVar38) && (bVar38 = uVar29 < 7, uVar29 = uVar29 + 1, bVar38));
                palVar16 = ptr + (uint)(iVar13 % (int)uVar25);
                sVar44 = (short)(*palVar16)[0];
                sVar47 = *(short *)((long)*palVar16 + 2);
                sVar5 = *(short *)((long)*palVar16 + 4);
                sVar6 = *(short *)((long)*palVar16 + 6);
                sVar7 = (short)(*palVar16)[1];
                sVar8 = *(short *)((long)*palVar16 + 10);
                sVar9 = *(short *)((long)*palVar16 + 0xc);
                sVar10 = *(short *)((long)*palVar16 + 0xe);
                sVar53 = auVar62._0_2_;
                auVar65._0_2_ = -(ushort)(sVar53 < sVar44);
                sVar50 = auVar62._2_2_;
                auVar65._2_2_ = -(ushort)(sVar50 < sVar47);
                sVar54 = auVar62._4_2_;
                auVar65._4_2_ = -(ushort)(sVar54 < sVar5);
                sVar55 = auVar62._6_2_;
                auVar65._6_2_ = -(ushort)(sVar55 < sVar6);
                sVar56 = auVar62._8_2_;
                auVar65._8_2_ = -(ushort)(sVar56 < sVar7);
                sVar57 = auVar62._10_2_;
                auVar65._10_2_ = -(ushort)(sVar57 < sVar8);
                sVar58 = auVar62._12_2_;
                auVar65._12_2_ = -(ushort)(sVar58 < sVar9);
                sVar59 = auVar62._14_2_;
                auVar65._14_2_ = -(ushort)(sVar59 < sVar10);
                auVar12._2_2_ = -(ushort)(sVar39 == 6);
                auVar12._0_2_ = -(ushort)(sVar52 == 7);
                auVar12._4_2_ = -(ushort)(sVar52 == 5);
                auVar12._6_2_ = -(ushort)(sVar39 == 4);
                auVar12._8_2_ = -(ushort)(sVar52 == 3);
                auVar12._10_2_ = -(ushort)(sVar39 == 2);
                auVar12._12_2_ = -(ushort)(sVar52 == 1);
                auVar12._14_2_ = -(ushort)(sVar39 == 0);
                auVar65 = auVar65 & auVar12;
                if ((((((((((((((((auVar65 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar65 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar65 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar65 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar65 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar65 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar65 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar65 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar65 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar65 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar65 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar65 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar65[0xf] < '\0') {
                  iVar32 = (int)uVar35;
                }
                auVar62._0_2_ =
                     (ushort)(sVar44 < sVar53) * sVar53 | (ushort)(sVar44 >= sVar53) * sVar44;
                auVar62._2_2_ =
                     (ushort)(sVar47 < sVar50) * sVar50 | (ushort)(sVar47 >= sVar50) * sVar47;
                auVar62._4_2_ =
                     (ushort)(sVar5 < sVar54) * sVar54 | (ushort)(sVar5 >= sVar54) * sVar5;
                auVar62._6_2_ =
                     (ushort)(sVar6 < sVar55) * sVar55 | (ushort)(sVar6 >= sVar55) * sVar6;
                auVar62._8_2_ =
                     (ushort)(sVar7 < sVar56) * sVar56 | (ushort)(sVar7 >= sVar56) * sVar7;
                auVar62._10_2_ =
                     (ushort)(sVar8 < sVar57) * sVar57 | (ushort)(sVar8 >= sVar57) * sVar8;
                auVar62._12_2_ =
                     (ushort)(sVar9 < sVar58) * sVar58 | (ushort)(sVar9 >= sVar58) * sVar9;
                auVar62._14_2_ =
                     (ushort)(sVar10 < sVar59) * sVar59 | (ushort)(sVar10 >= sVar59) * sVar10;
                uVar35 = uVar35 + 1;
                palVar16 = ptr_02;
                if (uVar35 == uVar34) {
                  if (s2_end != 0) {
                    if (iVar14 < 7) {
                      auVar42 = auVar62;
                      uVar29 = 1;
                      if (1 < (int)uVar28) {
                        uVar29 = uVar28;
                      }
                      do {
                        auVar63._0_8_ = auVar42._0_8_ << 0x10;
                        auVar63._8_8_ = auVar42._8_8_ << 0x10 | auVar42._0_8_ >> 0x30;
                        auVar62._14_2_ = auVar42._12_2_;
                        uVar29 = uVar29 - 1;
                        auVar42 = auVar63;
                      } while (uVar29 != 0);
                    }
                    uVar18 = (uint)auVar62._14_2_;
                  }
                  sVar52 = (short)uVar18;
                  iVar21 = iVar13;
                  if ((s1_end != 0) && (((ulong)uVar19 + 7 & 0x7ffffff8) != 0)) {
                    uVar26 = 0;
                    do {
                      iVar33 = ((uint)uVar26 & 7) * uVar25 + ((uint)(uVar26 >> 3) & 0x1fffffff);
                      if (iVar33 < (int)uVar19) {
                        auVar62._14_2_ = *(ushort *)((long)*ptr + uVar26 * 2);
                        if ((short)(ushort)uVar18 < (short)auVar62._14_2_) {
                          uVar18 = (uint)auVar62._14_2_;
                          iVar32 = iVar17;
                          iVar21 = iVar33;
                        }
                        else {
                          if (iVar21 <= iVar33) {
                            iVar33 = iVar21;
                          }
                          if (iVar32 != iVar17) {
                            iVar33 = iVar21;
                          }
                          if (auVar62._14_2_ == (ushort)uVar18) {
                            iVar21 = iVar33;
                          }
                        }
                      }
                      sVar52 = (short)uVar18;
                      uVar26 = uVar26 + 1;
                    } while ((uVar25 & 0xfffffff) << 3 != (int)uVar26);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    uVar26 = ptr[(uint)(iVar13 % (int)uVar25)][0];
                    uVar34 = ptr[(uint)(iVar13 % (int)uVar25)][1];
                    if (iVar14 < 7) {
                      uVar19 = 1;
                      if (1 < (int)uVar28) {
                        uVar19 = uVar28;
                      }
                      do {
                        uVar34 = uVar34 << 0x10 | uVar26 >> 0x30;
                        uVar19 = uVar19 - 1;
                        uVar26 = uVar26 << 0x10;
                      } while (uVar19 != 0);
                    }
                    sVar52 = (short)(uVar34 >> 0x30);
                    iVar32 = iVar17;
                    iVar21 = iVar13;
                  }
                  sVar39 = auVar41._0_2_;
                  auVar43._0_2_ = -(ushort)((short)auVar46._0_2_ < sVar39);
                  sVar44 = auVar41._2_2_;
                  auVar43._2_2_ = -(ushort)((short)auVar46._2_2_ < sVar44);
                  auVar43._4_2_ = -(ushort)((short)auVar46._4_2_ < sVar39);
                  auVar43._6_2_ = -(ushort)((short)auVar46._6_2_ < sVar44);
                  auVar43._8_2_ = -(ushort)((short)auVar46._8_2_ < sVar39);
                  auVar43._10_2_ = -(ushort)((short)auVar46._10_2_ < sVar44);
                  auVar43._12_2_ = -(ushort)((short)auVar46._12_2_ < sVar39);
                  auVar43._14_2_ = -(ushort)((short)auVar46._14_2_ < sVar44);
                  sVar39 = auVar45._0_2_;
                  auVar41._0_2_ = -(ushort)(sVar39 < (short)auVar48._0_2_);
                  sVar44 = auVar45._2_2_;
                  auVar41._2_2_ = -(ushort)(sVar44 < (short)auVar48._2_2_);
                  auVar41._4_2_ = -(ushort)(sVar39 < (short)auVar48._4_2_);
                  auVar41._6_2_ = -(ushort)(sVar44 < (short)auVar48._6_2_);
                  auVar41._8_2_ = -(ushort)(sVar39 < (short)auVar48._8_2_);
                  auVar41._10_2_ = -(ushort)(sVar44 < (short)auVar48._10_2_);
                  auVar41._12_2_ = -(ushort)(sVar39 < (short)auVar48._12_2_);
                  auVar41._14_2_ = -(ushort)(sVar44 < (short)auVar48._14_2_);
                  auVar41 = auVar41 | auVar43;
                  if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar41 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar41 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar41 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar41 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar41 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar41 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar41 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar41 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar41 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar41 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar41 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar41 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar41[0xf] < '\0') {
                    *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
                    sVar52 = 0;
                    iVar32 = 0;
                    iVar21 = 0;
                  }
                  ppVar15->score = (int)sVar52;
                  ppVar15->end_query = iVar21;
                  ppVar15->end_ref = iVar32;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr_02);
                  parasail_free(ptr);
                  return ppVar15;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}